

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mimemap.c
# Opt level: O3

void h2o_mimemap_on_context_init(h2o_mimemap_t *mimemap,h2o_context_t *ctx)

{
  kh_extmap_t *pkVar1;
  khint_t kVar2;
  byte bVar3;
  uint uVar4;
  
  pkVar1 = mimemap->extmap;
  kVar2 = pkVar1->n_buckets;
  if (kVar2 != 0) {
    bVar3 = 0;
    uVar4 = 0;
    do {
      if (((pkVar1->flags[uVar4 >> 4] >> (bVar3 & 0x1e) & 3) == 0) &&
         (pkVar1->vals[uVar4]->type == H2O_MIMEMAP_TYPE_DYNAMIC)) {
        h2o_context_init_pathconf_context
                  (ctx,(h2o_pathconf_t *)&(pkVar1->vals[uVar4]->data).field_0);
        pkVar1 = mimemap->extmap;
        kVar2 = pkVar1->n_buckets;
      }
      uVar4 = uVar4 + 1;
      bVar3 = bVar3 + 2;
    } while (uVar4 != kVar2);
  }
  return;
}

Assistant:

void h2o_mimemap_on_context_init(h2o_mimemap_t *mimemap, h2o_context_t *ctx)
{
    const char *ext;
    h2o_mimemap_type_t *type;

    kh_foreach(mimemap->extmap, ext, type, {
        switch (type->type) {
        case H2O_MIMEMAP_TYPE_DYNAMIC:
            h2o_context_init_pathconf_context(ctx, &type->data.dynamic.pathconf);
            break;
        case H2O_MIMEMAP_TYPE_MIMETYPE:
            break;
        }
    });
}